

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.hpp
# Opt level: O2

void kitty::swap_adjacent_inplace<4u>(static_truth_table<4U,_true> *tt,uint8_t var_index)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  undefined7 in_register_00000031;
  
  uVar1 = tt->_bits;
  lVar3 = (CONCAT71(in_register_00000031,var_index) & 0xffffffff) * 0x18;
  bVar2 = (byte)(1L << (var_index & 0x3f));
  tt->_bits = (uVar1 & *(ulong *)(detail::permutation_masks + lVar3 + 0x10)) >> (bVar2 & 0x3f) |
              (*(ulong *)(detail::permutation_masks + lVar3 + 8) & uVar1) << (bVar2 & 0x3f) |
              *(ulong *)(detail::permutation_masks + lVar3) & uVar1;
  return;
}

Assistant:

void swap_adjacent_inplace( static_truth_table<NumVars, true>& tt, uint8_t var_index )
{
  assert( var_index < tt.num_vars() );

  const auto shift = uint64_t( 1 ) << var_index;

  tt._bits = ( tt._bits & detail::permutation_masks[var_index][0] ) |
             ( ( tt._bits & detail::permutation_masks[var_index][1] ) << shift ) |
             ( ( tt._bits & detail::permutation_masks[var_index][2] ) >> shift );
}